

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

SQInteger __thiscall SQLexer::ReadNumber(SQLexer *this)

{
  int iVar1;
  SQInteger SVar2;
  SQUnsignedInteger SVar3;
  char *pcVar4;
  bool bVar5;
  double dVar6;
  char local_38;
  LexChar local_37;
  LexChar local_36;
  LexChar local_35;
  char local_34;
  LexChar local_33;
  LexChar local_32 [2];
  char *local_30;
  SQChar *sTemp;
  SQInteger firstchar;
  SQInteger type;
  SQLexer *this_local;
  
  firstchar = 1;
  sTemp = (SQChar *)(ulong)this->_currdata;
  local_32[1] = 0;
  type = (SQInteger)this;
  sqvector<char>::resize(&this->_longstr,0,(char *)(local_32 + 1));
  Next(this);
  this->_currentcolumn = this->_currentcolumn + 1;
  if ((sTemp == (SQChar *)0x30) &&
     ((iVar1 = toupper((uint)this->_currdata), iVar1 == 0x58 ||
      (SVar2 = scisodigit((ulong)this->_currdata), SVar2 != 0)))) {
    SVar2 = scisodigit((ulong)this->_currdata);
    if (SVar2 == 0) {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      firstchar = 3;
      while (iVar1 = isxdigit((uint)this->_currdata), iVar1 != 0) {
        local_33 = this->_currdata;
        sqvector<char>::push_back(&this->_longstr,(char *)&local_33);
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
      }
      SVar3 = sqvector<char>::size(&this->_longstr);
      if (0x10 < SVar3) {
        Error(this,"too many digits for an Hex number");
      }
    }
    else {
      firstchar = 5;
      while (SVar2 = scisodigit((ulong)this->_currdata), SVar2 != 0) {
        local_32[0] = this->_currdata;
        sqvector<char>::push_back(&this->_longstr,(char *)local_32);
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
      }
      iVar1 = isdigit((uint)this->_currdata);
      if (iVar1 != 0) {
        Error(this,"invalid octal number");
      }
    }
  }
  else {
    local_34 = (char)sTemp;
    sqvector<char>::push_back(&this->_longstr,&local_34);
    while( true ) {
      bVar5 = true;
      if (this->_currdata != '.') {
        iVar1 = isdigit((uint)this->_currdata);
        bVar5 = true;
        if (iVar1 == 0) {
          SVar2 = isexponent((ulong)this->_currdata);
          bVar5 = SVar2 != 0;
        }
      }
      if (!bVar5) break;
      if ((this->_currdata == '.') || (SVar2 = isexponent((ulong)this->_currdata), SVar2 != 0)) {
        firstchar = 2;
      }
      SVar2 = isexponent((ulong)this->_currdata);
      if (SVar2 != 0) {
        if (firstchar != 2) {
          Error(this,"invalid numeric format");
        }
        firstchar = 4;
        local_35 = this->_currdata;
        sqvector<char>::push_back(&this->_longstr,(char *)&local_35);
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        if ((this->_currdata == '+') || (this->_currdata == '-')) {
          local_36 = this->_currdata;
          sqvector<char>::push_back(&this->_longstr,(char *)&local_36);
          Next(this);
          this->_currentcolumn = this->_currentcolumn + 1;
        }
        iVar1 = isdigit((uint)this->_currdata);
        if (iVar1 == 0) {
          Error(this,"exponent expected");
        }
      }
      local_37 = this->_currdata;
      sqvector<char>::push_back(&this->_longstr,(char *)&local_37);
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
    }
  }
  local_38 = '\0';
  sqvector<char>::push_back(&this->_longstr,&local_38);
  switch(firstchar) {
  case 1:
    pcVar4 = sqvector<char>::operator[](&this->_longstr,0);
    LexInteger(pcVar4,(SQUnsignedInteger *)&this->_nvalue);
    this_local = (SQLexer *)0x104;
    break;
  case 2:
  case 4:
    pcVar4 = sqvector<char>::operator[](&this->_longstr,0);
    dVar6 = strtod(pcVar4,&local_30);
    this->_fvalue = (float)dVar6;
    this_local = (SQLexer *)0x105;
    break;
  case 3:
    pcVar4 = sqvector<char>::operator[](&this->_longstr,0);
    LexHexadecimal(pcVar4,(SQUnsignedInteger *)&this->_nvalue);
    this_local = (SQLexer *)0x104;
    break;
  case 5:
    pcVar4 = sqvector<char>::operator[](&this->_longstr,0);
    LexOctal(pcVar4,(SQUnsignedInteger *)&this->_nvalue);
    this_local = (SQLexer *)0x104;
    break;
  default:
    this_local = (SQLexer *)0x0;
  }
  return (SQInteger)this_local;
}

Assistant:

SQInteger SQLexer::ReadNumber()
{
#define TINT 1
#define TFLOAT 2
#define THEX 3
#define TSCIENTIFIC 4
#define TOCTAL 5
    SQInteger type = TINT, firstchar = CUR_CHAR;
    SQChar *sTemp;
    INIT_TEMP_STRING();
    NEXT();
    if(firstchar == _SC('0') && (toupper(CUR_CHAR) == _SC('X') || scisodigit(CUR_CHAR)) ) {
        if(scisodigit(CUR_CHAR)) {
            type = TOCTAL;
            while(scisodigit(CUR_CHAR)) {
                APPEND_CHAR(CUR_CHAR);
                NEXT();
            }
            if(scisdigit(CUR_CHAR)) Error(_SC("invalid octal number"));
        }
        else {
            NEXT();
            type = THEX;
            while(isxdigit(CUR_CHAR)) {
                APPEND_CHAR(CUR_CHAR);
                NEXT();
            }
            if(_longstr.size() > MAX_HEX_DIGITS) Error(_SC("too many digits for an Hex number"));
        }
    }
    else {
        APPEND_CHAR((int)firstchar);
        while (CUR_CHAR == _SC('.') || scisdigit(CUR_CHAR) || isexponent(CUR_CHAR)) {
            if(CUR_CHAR == _SC('.') || isexponent(CUR_CHAR)) type = TFLOAT;
            if(isexponent(CUR_CHAR)) {
                if(type != TFLOAT) Error(_SC("invalid numeric format"));
                type = TSCIENTIFIC;
                APPEND_CHAR(CUR_CHAR);
                NEXT();
                if(CUR_CHAR == '+' || CUR_CHAR == '-'){
                    APPEND_CHAR(CUR_CHAR);
                    NEXT();
                }
                if(!scisdigit(CUR_CHAR)) Error(_SC("exponent expected"));
            }

            APPEND_CHAR(CUR_CHAR);
            NEXT();
        }
    }
    TERMINATE_BUFFER();
    switch(type) {
    case TSCIENTIFIC:
    case TFLOAT:
        _fvalue = (SQFloat)scstrtod(&_longstr[0],&sTemp);
        return TK_FLOAT;
    case TINT:
        LexInteger(&_longstr[0],(SQUnsignedInteger *)&_nvalue);
        return TK_INTEGER;
    case THEX:
        LexHexadecimal(&_longstr[0],(SQUnsignedInteger *)&_nvalue);
        return TK_INTEGER;
    case TOCTAL:
        LexOctal(&_longstr[0],(SQUnsignedInteger *)&_nvalue);
        return TK_INTEGER;
    }
    return 0;
}